

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

void __thiscall llm_graph_input_s_copy::set_input(llm_graph_input_s_copy *this,llama_ubatch *ubatch)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  reference pvVar4;
  int iVar5;
  long in_RDI;
  llama_kv_cell *kv_cell;
  uint32_t cell_id;
  uint32_t i;
  int32_t *data;
  int64_t n_kv;
  uint local_24;
  
  uVar1 = *(uint *)(*(long *)(in_RDI + 0x10) + 0x74);
  if (*(long *)(in_RDI + 8) != 0) {
    uVar3 = ggml_backend_buffer_is_host(*(undefined8 *)(*(long *)(in_RDI + 8) + 8));
    if ((uVar3 & 1) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x10c,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_host(s_copy->buffer)");
    }
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0xf8);
    for (local_24 = 0; local_24 < uVar1; local_24 = local_24 + 1) {
      iVar5 = local_24 + *(int *)(*(long *)(in_RDI + 0x10) + 0x68);
      pvVar4 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                         ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                          (*(long *)(in_RDI + 0x10) + 0x78),(ulong)local_24);
      if ((pvVar4->src < 0) || (*(uint *)(*(long *)(in_RDI + 0x10) + 0x6c) <= (uint)pvVar4->src)) {
        pvVar4->src = iVar5;
      }
      *(int32_t *)(lVar2 + (ulong)local_24 * 4) = pvVar4->src;
      if (pvVar4->src != iVar5) {
        pvVar4->src = iVar5;
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_s_copy::set_input(const llama_ubatch * ubatch) {
    GGML_UNUSED(ubatch);

    const int64_t n_kv = kv_self->n;

    if (s_copy) {
        GGML_ASSERT(ggml_backend_buffer_is_host(s_copy->buffer));
        int32_t * data = (int32_t *) s_copy->data;

        // assuming copy destinations ALWAYS happen ONLY on the cells between head and head+n
        for (uint32_t i = 0; i < n_kv; ++i) {
            const uint32_t  cell_id = i + kv_self->head;

            //////////////////////////////////////////////
            // TODO: this should not mutate the KV cache !
            llama_kv_cell & kv_cell = const_cast<class llama_kv_cache_unified *>(kv_self)->cells[i];

            // prevent out-of-bound sources
            if (kv_cell.src < 0 || (uint32_t) kv_cell.src >= kv_self->size) {
                kv_cell.src = cell_id;
            }

            data[i] = kv_cell.src;

            // TODO: do not mutate the KV cache
            // ensure copy only happens once
            if (kv_cell.src != (int32_t) cell_id) {
                kv_cell.src = cell_id;
            }
        }
    }
}